

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMulsMusashi<(moira::Core)0,(moira::Instr)81,(moira::Mode)10,2>
          (Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(opcode >> 9 & 7);
  uVar1 = computeEA<(moira::Core)0,(moira::Mode)10,2,0ull>(this,opcode & 7);
  uVar2 = read<(moira::Core)0,(moira::AddrSpace)2,2,0ull>(this,uVar1);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)0,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  iVar3 = (int)(short)uVar2 * (int)*(short *)((long)&(this->reg).field_3 + uVar4 * 4);
  (this->reg).sr.n = SUB41((uint)iVar3 >> 0x1f,0);
  (this->reg).sr.z = iVar3 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)&(this->reg).field_3 + uVar4 * 4) = iVar3;
  return;
}

Assistant:

void
Moira::execMulsMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = muls<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}